

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O3

void __thiscall Fossilize::ApplicationInfoFilter::ApplicationInfoFilter(ApplicationInfoFilter *this)

{
  Impl *pIVar1;
  
  pIVar1 = (Impl *)operator_new(0x120);
  (pIVar1->blacklisted_application_names)._M_h._M_buckets =
       &(pIVar1->blacklisted_application_names)._M_h._M_single_bucket;
  (pIVar1->blacklisted_application_names)._M_h._M_bucket_count = 1;
  (pIVar1->blacklisted_application_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->blacklisted_application_names)._M_h._M_element_count = 0;
  (pIVar1->blacklisted_application_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->blacklisted_application_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->blacklisted_application_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->blacklisted_engine_names)._M_h._M_buckets =
       &(pIVar1->blacklisted_engine_names)._M_h._M_single_bucket;
  (pIVar1->blacklisted_engine_names)._M_h._M_bucket_count = 1;
  (pIVar1->blacklisted_engine_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->blacklisted_engine_names)._M_h._M_element_count = 0;
  (pIVar1->blacklisted_engine_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->blacklisted_engine_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->blacklisted_engine_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->application_infos)._M_h._M_buckets = &(pIVar1->application_infos)._M_h._M_single_bucket;
  (pIVar1->application_infos)._M_h._M_bucket_count = 1;
  (pIVar1->application_infos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->application_infos)._M_h._M_element_count = 0;
  (pIVar1->application_infos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pIVar1->application_infos)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->application_infos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pIVar1->engine_infos)._M_h._M_buckets = &(pIVar1->engine_infos)._M_h._M_single_bucket;
  (pIVar1->engine_infos)._M_h._M_bucket_count = 1;
  (pIVar1->engine_infos)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pIVar1->engine_infos)._M_h._M_element_count = 0;
  (pIVar1->engine_infos)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  pIVar1->getenv_wrapper = (_func_char_ptr_char_ptr_void_ptr *)0x0;
  pIVar1->getenv_userdata = (void *)0x0;
  (pIVar1->default_variant_dependencies_feature).
  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->default_variant_dependencies_feature).
  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar1->default_variant_dependencies).
  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar1->default_variant_dependencies_feature).
  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->default_variant_dependencies).
  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->default_variant_dependencies).
  super__Vector_base<Fossilize::VariantDependency,_std::allocator<Fossilize::VariantDependency>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->engine_infos)._M_h._M_rehash_policy._M_next_resize = 0;
  (pIVar1->engine_infos)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->impl = pIVar1;
  return;
}

Assistant:

ApplicationInfoFilter::ApplicationInfoFilter()
{
	impl = new Impl;
}